

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DES.cpp
# Opt level: O2

SequenceD<64> * __thiscall
DES::operator()(SequenceD<64> *__return_storage_ptr__,DES *this,SequenceD<64> *seq)

{
  int iVar1;
  bool bVar2;
  SequenceD<64> tmp;
  SequenceD<64> swapSeq;
  Sequence tmpSeq;
  Sequence local_1a0;
  Sequence xorSeq;
  F f;
  
  F::F(&f,&this->m_key);
  Permutation<64,_64>::operator()(&tmp,(Permutation<64,_64> *)&swapSeq,seq,&INITIAL_PERMUTATION);
  iVar1 = 0x10;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    F::operator()(&tmpSeq,&f,&tmp.m_other);
    Sequence::Sequence(&local_1a0,&tmpSeq);
    Sequence::operator*(&xorSeq,&tmp.super_Sequence,&local_1a0);
    Sequence::~Sequence(&local_1a0);
    SequenceD<64>::SequenceD(&swapSeq,&tmp.m_other,&xorSeq);
    SequenceD<64>::operator=(&tmp,&swapSeq);
    SequenceD<64>::~SequenceD(&swapSeq);
    Sequence::~Sequence(&xorSeq);
    Sequence::~Sequence(&tmpSeq);
  }
  SequenceD<64>::SequenceD(&swapSeq,&tmp.m_other,&tmp.super_Sequence);
  Permutation<64,_64>::operator()
            (__return_storage_ptr__,(Permutation<64,_64> *)&tmpSeq,&swapSeq,
             &INITIAL_PERMUTATION_REVERSE);
  SequenceD<64>::~SequenceD(&swapSeq);
  SequenceD<64>::~SequenceD(&tmp);
  F::~F(&f);
  return __return_storage_ptr__;
}

Assistant:

SequenceD<64> DES::operator()(SequenceD<64> seq) {
    F f(m_key);
    // Initial permutation
    auto tmp = Permutation<64, 64>{}(seq, INITIAL_PERMUTATION);

    // For each round, compute the intermediate sequence
    for (auto i = 0; i < 16; ++i) {
        auto tmpSeq = f(tmp.right());
        auto xorSeq = tmp.left() * tmpSeq;
        tmp = SequenceD<64>{tmp.right(), xorSeq};
    }

    // Final byte swao and permutation
    auto swapSeq = SequenceD<64>{tmp.right(), tmp.left()};
    return Permutation<64, 64>{}(swapSeq, INITIAL_PERMUTATION_REVERSE);
}